

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void gimage::imageToJET<float>
               (ImageU8 *ret,Image<float,_gimage::PixelTraits<float>_> *image,double imin,
               double imax)

{
  float fVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long pn;
  long lVar5;
  long lVar6;
  size_t __n;
  uchar ****ppppuVar7;
  uchar uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (ret,image->width,image->height,3);
  auVar3 = _DAT_0014f150;
  if (imax <= imin) {
    lVar5 = image->n;
    lVar6 = -lVar5;
    if (0 < lVar5) {
      lVar6 = lVar5;
    }
    if (lVar5 == 0) {
      imin = 3.4028234663852886e+38;
    }
    else {
      lVar10 = 0;
      fVar14 = 3.4028235e+38;
      do {
        fVar1 = image->pixel[lVar10];
        fVar15 = fVar14;
        if (((uint)ABS(fVar1) < 0x7f800000) && (fVar15 = fVar1, fVar14 <= fVar1)) {
          fVar15 = fVar14;
        }
        lVar10 = lVar10 + 1;
        fVar14 = fVar15;
      } while (lVar6 != lVar10);
      imin = (double)fVar15;
    }
    if (lVar5 == 0) {
      imax = -3.4028234663852886e+38;
    }
    else {
      lVar5 = 0;
      fVar14 = -3.4028235e+38;
      do {
        fVar1 = image->pixel[lVar5];
        fVar15 = fVar14;
        if (((uint)ABS(fVar1) < 0x7f800000) && (fVar15 = fVar1, fVar1 <= fVar14)) {
          fVar15 = fVar14;
        }
        lVar5 = lVar5 + 1;
        fVar14 = fVar15;
      } while (lVar6 != lVar5);
      imax = (double)fVar15;
    }
  }
  if (imax - imin <= 0.0) {
    sVar2 = ret->n;
    __n = -sVar2;
    if (0 < (long)sVar2) {
      __n = sVar2;
    }
    memset(ret->pixel,0,__n);
    return;
  }
  if (0 < image->height) {
    ppppuVar7 = &ret->img;
    lVar5 = 0;
    do {
      if (0 < image->width) {
        lVar6 = 0;
        do {
          uVar11 = (ulong)image->depth;
          bVar13 = (long)uVar11 < 1;
          if ((long)uVar11 < 1) {
LAB_0012d724:
            if (!bVar13) goto LAB_0012d7c7;
            dVar16 = (((double)(*image->img)[lVar5][lVar6] - imin) / (imax - imin)) / 1.15 + 0.1;
            dVar19 = ABS(dVar16 + -0.75) * -4.0 + 1.5;
            if (1.0 <= dVar19) {
              dVar19 = 1.0;
            }
            auVar17._0_8_ = ABS(dVar16 + -0.25) * -4.0 + 1.5;
            auVar17._8_8_ = ABS(dVar16 + -0.5) * -4.0 + 1.5;
            auVar18 = minpd(auVar17,auVar3);
            dVar16 = auVar18._0_8_;
            dVar20 = auVar18._8_8_;
            auVar18._8_4_ = (int)-(ulong)(0.0 < dVar20);
            auVar18._0_8_ = -(ulong)(0.0 < dVar16);
            auVar18._12_4_ = (int)(-(ulong)(0.0 < dVar20) >> 0x20);
            uVar9 = movmskpd((int)(*image->img)[lVar5],auVar18);
            if ((uVar9 & 2) == 0) {
              dVar20 = 0.0;
            }
            if ((uVar9 & 1) == 0) {
              dVar16 = 0.0;
            }
            if (dVar19 <= 0.0) {
              dVar19 = 0.0;
            }
            (**ppppuVar7)[lVar5][lVar6] = (uchar)(int)(dVar19 * 255.0 + 0.5);
            (*ppppuVar7)[1][lVar5][lVar6] = (uchar)(int)(dVar20 * 255.0 + 0.5);
            uVar8 = (uchar)(int)(dVar16 * 255.0 + 0.5);
          }
          else {
            if ((uint)ABS((*image->img)[lVar5][lVar6]) < 0x7f800000) {
              uVar4 = 1;
              do {
                uVar12 = uVar4;
                if (uVar11 == uVar12) break;
                uVar4 = uVar12 + 1;
              } while ((uint)ABS(image->img[uVar12][lVar5][lVar6]) < 0x7f800000);
              bVar13 = uVar11 <= uVar12;
              goto LAB_0012d724;
            }
LAB_0012d7c7:
            uVar8 = '\0';
            (**ppppuVar7)[lVar5][lVar6] = '\0';
            (*ppppuVar7)[1][lVar5][lVar6] = '\0';
          }
          (*ppppuVar7)[2][lVar5][lVar6] = uVar8;
          lVar6 = lVar6 + 1;
        } while (lVar6 < image->width);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < image->height);
  }
  return;
}

Assistant:

void imageToJET(ImageU8 &ret, const Image<T> &image, double imin=0, double imax=-1)
{
  ret.setSize(image.getWidth(), image.getHeight(), 3);

  if (imax <= imin)
  {
    imin=image.minValue();
    imax=image.maxValue();
  }

  double irange=imax-imin;

  if (irange <= 0)
  {
    ret.clear();
    return;
  }

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      if (image.isValid(i, k))
      {
        double v=image.get(i, k, 0);

        v=(v-imin)/irange;
        v=v/1.15+0.1;

        double r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
        double g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
        double b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));

        ret.set(i, k, 0, static_cast<unsigned char>(255*r+0.5));
        ret.set(i, k, 1, static_cast<unsigned char>(255*g+0.5));
        ret.set(i, k, 2, static_cast<unsigned char>(255*b+0.5));
      }
      else
      {
        ret.set(i, k, 0, 0);
        ret.set(i, k, 1, 0);
        ret.set(i, k, 2, 0);
      }
    }
  }
}